

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

tc_toktyp_t __thiscall
CTcTokenizer::xlat_string_to
          (CTcTokenizer *this,char *dstp,utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,
          int force_embed_end)

{
  tok_embed_level *ptVar1;
  char *pcVar2;
  wchar_t qu;
  int iVar3;
  tc_toktyp_t tVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  size_t sVar7;
  ulong uVar8;
  tc_toktyp_t tVar9;
  size_t bytecnt;
  CTcTokenizer *pCVar10;
  CTcTokenizer *this_00;
  int triple;
  utf8_ptr local_80;
  char *local_78;
  CTcTokenizer *local_70;
  utf8_ptr fmt;
  utf8_ptr dst;
  CTcToken ftok;
  
  local_80.p_ = dstp;
  qu = utf8_ptr::getch(p);
  local_78 = dstp;
  if (qu == L'\"') {
    tVar4 = TOKT_DSTR;
LAB_0024a02d:
    tok->typ_ = tVar4;
  }
  else {
    if (qu == L'\'') {
      tVar4 = TOKT_SSTR;
      goto LAB_0024a02d;
    }
    if (qu != L'R') {
      tVar4 = TOKT_INVALID;
      if ((ec != (tok_embed_ctx *)0x0) && (ec->level != 0)) {
        tVar4 = ec->s->endtok;
      }
      goto LAB_0024a02d;
    }
    tok->typ_ = TOKT_RESTR;
    utf8_ptr::inc(p);
    qu = utf8_ptr::getch(p);
  }
  triple = 0;
  if (((qu == L'\'') || (qu == L'\"')) && (iVar3 = count_quotes(p,qu), 2 < iVar3)) {
    utf8_ptr::inc(p);
    utf8_ptr::inc(p);
    triple = 1;
  }
  utf8_ptr::inc(p);
  local_70 = this;
  if (force_embed_end == 0) {
    if (qu == L'>') {
      if ((ec->level == 0) || (ec->s->parens == 0)) {
        utf8_ptr::inc(p);
        if (ec->level == 0) {
          triple = 0;
          qu = L'\0';
        }
        else {
          qu = ec->s->qu;
          triple = ec->s->triple;
        }
        goto LAB_0024a0f5;
      }
      qu = L'>';
    }
  }
  else {
    utf8_ptr::dec(p);
    if (ec->level == 0) {
      triple = 0;
      qu = L'\0';
      tVar4 = TOKT_INVALID;
    }
    else {
      ptVar1 = ec->s;
      tVar4 = ptVar1->endtok;
      qu = ptVar1->qu;
      triple = ptVar1->triple;
    }
    tok->typ_ = tVar4;
LAB_0024a0f5:
    tok_embed_ctx::end_expr(ec);
  }
  while( true ) {
    while( true ) {
      pCVar10 = (CTcTokenizer *)p;
      wVar5 = utf8_ptr::getch(p);
      if (wVar5 == qu) {
        if (triple == 0) {
          utf8_ptr::inc(p);
          goto LAB_0024a3b4;
        }
        pCVar10 = (CTcTokenizer *)p;
        iVar3 = count_quotes(p,qu);
        pcVar2 = local_78;
        if (2 < iVar3) goto LAB_0024a270;
      }
      pcVar2 = local_78;
      if (wVar5 != L'\\') break;
      xlat_escape(pCVar10,&local_80,p,qu,triple);
    }
    if (wVar5 == L'\0') {
      bytecnt = (long)local_80.p_ - (long)local_78;
      tok->text_ = local_78;
      tok->text_len_ = bytecnt;
      *local_80.p_ = '\0';
      local_80.p_ = local_80.p_ + 1;
      sVar7 = utf8_ptr::s_len(local_78,bytecnt);
      if (0x14 < sVar7) {
        bytecnt = utf8_ptr::s_bytelen(pcVar2,0x14);
      }
      pCVar10 = local_70;
      if (((qu == L'\"') && (tok->text_len_ == 0)) &&
         (sVar7 = (local_70->unsplicebuf_).buf_len_, sVar7 != 0)) {
        CTcTokString::ensure_space(&local_70->unsplicebuf_,sVar7 + 2);
        pcVar2 = (pCVar10->unsplicebuf_).buf_;
        memmove(pcVar2 + 1,pcVar2,(pCVar10->unsplicebuf_).buf_len_);
        uVar8 = (pCVar10->unsplicebuf_).buf_len_ + 1;
        (pCVar10->unsplicebuf_).buf_len_ = uVar8;
        if (uVar8 < (pCVar10->unsplicebuf_).buf_size_) {
          (pCVar10->unsplicebuf_).buf_[uVar8] = '\0';
        }
        *pcVar2 = '\"';
        return TOKT_NULLTOK;
      }
      log_error(0x2b11,(ulong)(uint)(int)(char)qu,bytecnt & 0xffffffff,pcVar2,
                (ulong)(uint)(int)(char)qu);
      return tok->typ_;
    }
    if ((((ec != (tok_embed_ctx *)0x0) && (wVar5 == L'<')) && (tok->typ_ != TOKT_RESTR)) &&
       (wVar6 = utf8_ptr::getch_at(p,1), wVar6 == L'<')) break;
    sVar7 = utf8_ptr::s_putch(local_80.p_,wVar5);
    local_80.p_ = local_80.p_ + sVar7;
    utf8_ptr::inc(p);
  }
  tVar4 = tok->typ_;
  if (tVar4 == TOKT_SSTR) {
    tVar9 = TOKT_SSTR_START;
  }
  else if (tVar4 == TOKT_DSTR) {
    tVar9 = TOKT_DSTR_START;
  }
  else if (tVar4 == TOKT_DSTR_END) {
    tVar9 = TOKT_DSTR_MID;
  }
  else {
    tVar9 = TOKT_SSTR_MID;
    if (tVar4 != TOKT_SSTR_END) {
      tVar9 = tVar4;
    }
  }
  tok->typ_ = tVar9;
  utf8_ptr::inc_by(p,2);
  wVar5 = utf8_ptr::getch(p);
  pCVar10 = local_70;
  if (wVar5 == L'%') {
    pcVar2 = p->p_;
    this_00 = local_70;
    fmt.p_ = pcVar2;
    scan_sprintf_spec(local_70,p);
    dst.p_ = pcVar2;
    xlat_escapes(this_00,&dst,&fmt,p);
    ftok.text_len_ = (long)dst.p_ - (long)pcVar2;
    ftok.typ_ = TOKT_FMTSPEC;
    ftok.text_ = pcVar2;
    push(pCVar10,&ftok);
  }
  tok_embed_ctx::start_expr(ec,qu,triple,1);
LAB_0024a3b4:
  tok->text_ = local_78;
  tok->text_len_ = (long)local_80.p_ - (long)local_78;
  *local_80.p_ = '\0';
  return tok->typ_;
LAB_0024a270:
  for (; 3 < iVar3; iVar3 = iVar3 + -1) {
    sVar7 = utf8_ptr::s_putch(local_80.p_,qu);
    local_80.p_ = local_80.p_ + sVar7;
    utf8_ptr::inc(p);
  }
  utf8_ptr::inc_by(p,3);
  local_78 = pcVar2;
  goto LAB_0024a3b4;
}

Assistant:

tc_toktyp_t CTcTokenizer::xlat_string_to(
    char *dstp, utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec,
    int force_embed_end)
{
    /* set up our output utf8 pointer */
    utf8_ptr dst(dstp);

    /* note the open quote character */
    wchar_t qu = p->getch();

    /* set the appropriate string token type */
    tok->settyp(qu == '"' ? TOKT_DSTR :
                qu == '\'' ? TOKT_SSTR :
                qu == 'R' ? TOKT_RESTR :
                ec != 0 ? ec->endtok() :
                TOKT_INVALID);

    /* if it's a regex string, skip the 'R' and note the actual quote type */
    if (qu == 'R')
    {
        p->inc();
        qu = p->getch();
    }

    /* 
     *   If we're at a quote (rather than at '>>' for continuing from an
     *   embedded expression), count consecutive open quotes, to determine if
     *   we're in a triple-quoted string.  
     */
    int triple = FALSE;
    if (qu == '"' || qu == '\'')
    {
        /* count the consecutive open quotes */
        if (count_quotes(p, qu) >= 3)
        {
            /* skip past the additional two open quotes */
            p->inc();
            p->inc();

            /* note that we're in a triple-quoted string */
            triple = TRUE;
        }
    }

    /* skip the open quote */
    p->inc();

    /* check for the end of an embedded expression (forced or actual) */
    if (force_embed_end)
    {
        /* 
         *   they want us to assume the embedding ends here, regardless of
         *   what we're looking at - act the same as though we had
         *   actually seen '>>', but don't skip any input (in fact, back
         *   up one, since we already skipped one character for what we
         *   had thought was the open quote 
         */
        p->dec();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();
        tok->settyp(ec->endtok());

        /* clear the caller's in-embedding status */
        ec->end_expr();
    }
    else if (qu == '>' && ec->parens() == 0)
    {
        /* skip the second '>' */
        p->inc();

        /* restore the enclosing string context */
        qu = ec->qu();
        triple = ec->triple();

        /* end the expression */
        ec->end_expr();
    }

    /* scan the string and translate quotes */
    for (;;)
    {
        /* get this character */
        wchar_t cur = p->getch();

        /* if this is the matching quote, we're done */
        if (cur == qu)
        {
            /* 
             *   If we're in a triple-quote string, count consecutive quotes.
             *   Triple quotes are greedy: if we have N>3 quotes in a row,
             *   the first N-3 are inside the string, and the last 3 are the
             *   terminating quotes. 
             */
            if (triple)
            {
                /* we need at least three quotes to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* copy all but the last three quotes to the output */
                    for ( ; qcnt > 3 ; --qcnt, p->inc())
                        dst.setch(qu);

                    /* skip the three quotes */
                    p->inc_by(3);

                    /* done with the string */
                    break;
                }
            }
            else
            {
                /* 
                 *   It's an ordinary string, which ends with just one
                 *   matching quote, so we're done no matter what follows.
                 *   Skip the quote and stop scanning.
                 */
                p->inc();
                break;
            }
        }

        /* 
         *   if we find an end-of-line within the string, it's an error -
         *   we should always splice strings together onto a single line
         *   before starting to tokenize the line 
         */
        if (cur == '\0')
        {
            /* set the token's text pointer */
            size_t bytelen = dst.getptr() - dstp;
            tok->set_text(dstp, bytelen);

            /* null-terminate the result string */
            dst.setch('\0');

            /* 
             *   get the length of the unterminated string so far, but for
             *   error logging, limit the length to twenty characters --
             *   we just want to give the user enough information to find
             *   the string in error, without making the error message
             *   huge 
             */
            utf8_ptr dp(dstp);
            size_t charlen = dp.len(bytelen);
            if (charlen > 20)
                bytelen = dp.bytelen(20);

            /*
             *   Check for a special heuristic case.  If the string was of
             *   zero length, and we have something sitting in our
             *   unsplice buffer, here's what probably happened: the input
             *   was missing a ">>" sequence at the end of an embedded
             *   expression, and the parser told us to put it back in.  We
             *   had earlier decided we needed to splice up to a quote to
             *   end what looked to us like an unterminated string.  If
             *   this is the case, we and the parser are working at cross
             *   purposes; the parser is smarter than we are, so we should
             *   synchronize with it.  
             */
            if (tok->get_text_len() == 0
                && qu == '"'
                && unsplicebuf_.get_text_len() != 0)
            {
                /* 
                 *   we must have spliced a line to finish a string -
                 *   insert the quote into the splice buffer, and ignore
                 *   it here 
                 */

                /* 
                 *   make sure there's room for one more character (plus a
                 *   null byte) 
                 */
                unsplicebuf_.ensure_space(unsplicebuf_.get_text_len() + 2);

                /* get the buffer pointer */
                char *buf = unsplicebuf_.get_buf();

                /* make room for the '"' */
                memmove(buf + 1, buf, unsplicebuf_.get_text_len());
                unsplicebuf_.set_text_len(unsplicebuf_.get_text_len() + 1);

                /* add the '"' */
                *buf = '"';

                /* 
                 *   return the 'null token' to tell the caller to try
                 *   again - do not log an error at this point 
                 */
                return TOKT_NULLTOK;
            }

            /* log the error */
            log_error(TCERR_UNTERM_STRING,
                      (char)qu, (int)bytelen, dstp, (char)qu);

            /* return the string type */
            return tok->gettyp();
        }

        /* if this is an escape, translate it */
        if (cur == '\\')
        {
            /* translate the escape */
            xlat_escape(&dst, p, qu, triple);
            continue;
        }
        else if (ec != 0
                 && tok->gettyp() != TOKT_RESTR
                 && cur == '<' && p->getch_at(1) == '<')
        {
            /* 
             *   It's the start of an embedded expression - change the type
             *   to so indicate.  If we think we have a regular SSTR or DSTR,
             *   switch to the appropriate START type, since the part up to
             *   here is actually the starting fragment of a string with an
             *   embedded expression.  If we think we're in an END section,
             *   switch to the corresponding MID section, since we're parsing
             *   a fragment that already followed an embedding.  The only
             *   other possibility is that we're in a MID section, in which
             *   case just stay in the same MID section.  
             */
            tc_toktyp_t tt = tok->gettyp();
            tok->settyp(tt == TOKT_DSTR ? TOKT_DSTR_START :
                        tt == TOKT_DSTR_END ? TOKT_DSTR_MID :
                        tt == TOKT_SSTR ? TOKT_SSTR_START :
                        tt == TOKT_SSTR_END ? TOKT_SSTR_MID :
                        tt);

            /* skip the << */
            p->inc_by(2);

            /*
             *   Check for a '%' sprintf-style formatting sequence.  If we
             *   have a '%' immediately after the second '<', it's a sprintf
             *   format code. 
             */
            if (p->getch() == '%')
            {
                /* remember the starting point of the format string */
                utf8_ptr fmt(p);

                /* scan the format spec */
                scan_sprintf_spec(p);

                /* translate escapes */
                utf8_ptr dst(&fmt);
                xlat_escapes(&dst, &fmt, p);

                /* push the format spec into the token stream */
                CTcToken ftok;
                ftok.set_text(fmt.getptr(), dst.getptr() - fmt.getptr());
                ftok.settyp(TOKT_FMTSPEC);
                push(&ftok);
            }

            /* tell the caller we're in an embedding */
            ec->start_expr(qu, triple, TRUE);

            /* stop scanning */
            break;
        }

        /* copy this character to the output position */
        dst.setch(cur);

        /* get the next character */
        p->inc();
    }

    /* set the token's text pointer */
    tok->set_text(dstp, dst.getptr() - dstp);

    /* null-terminate the result string */
    dst.setch('\0');

    /* return the string type */
    return tok->gettyp();
}